

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O3

void Amap_ManPrintCuts(Amap_Obj_t *pNode)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  ulong uVar4;
  
  printf("NODE %5d : Type = ",(ulong)(*(uint *)pNode >> 3));
  uVar2 = (*(uint *)pNode & 7) - 4;
  if (uVar2 < 3) {
    printf(&DAT_0085d604 + *(int *)(&DAT_0085d604 + (ulong)uVar2 * 4));
  }
  printf("  Cuts = %d\n",(ulong)(*(uint *)&pNode->field_0x8 >> 0xc));
  if (0xfff < *(uint *)&pNode->field_0x8) {
    puVar3 = (uint *)(pNode->field_11).pData;
    uVar2 = 0;
    do {
      printf("%3d :  Mat= %3d  Inv=%d  ",(ulong)uVar2,(ulong)(*puVar3 & 0xffff),
             (ulong)(*puVar3 >> 0x10 & 1));
      if (0x1ffff < *puVar3) {
        uVar4 = 0;
        do {
          uVar1 = puVar3[uVar4 + 1];
          if ((int)uVar1 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10c,"int Abc_Lit2Var(int)");
          }
          printf("%d%c ",(ulong)(uVar1 >> 1),(ulong)((uVar1 & 1) * 2 + 0x2b));
          uVar4 = uVar4 + 1;
        } while (uVar4 < *puVar3 >> 0x11);
      }
      putchar(10);
      uVar2 = uVar2 + 1;
      puVar3 = puVar3 + (ulong)(*puVar3 >> 0x11) + 1;
    } while (uVar2 < *(uint *)&pNode->field_0x8 >> 0xc);
  }
  return;
}

Assistant:

void Amap_ManPrintCuts( Amap_Obj_t * pNode )
{
    Amap_Cut_t * pCut;
    int c, i;
    printf( "NODE %5d : Type = ", pNode->Id );
    if ( pNode->Type == AMAP_OBJ_AND )
        printf( "AND" );
    else if ( pNode->Type == AMAP_OBJ_XOR )
        printf( "XOR" );
    else if ( pNode->Type == AMAP_OBJ_MUX )
        printf( "MUX" );
    printf( "  Cuts = %d\n", pNode->nCuts );
    Amap_NodeForEachCut( pNode, pCut, c )
    {
        printf( "%3d :  Mat= %3d  Inv=%d  ", c, pCut->iMat, pCut->fInv );
        for ( i = 0; i < (int)pCut->nFans; i++ )
            printf( "%d%c ", Abc_Lit2Var(pCut->Fans[i]), Abc_LitIsCompl(pCut->Fans[i])?'-':'+' );
        printf( "\n" );
    }
}